

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_dump_image_header(opj_image_t *img_header,opj_bool dev_dump_flag,FILE *out_stream)

{
  undefined1 uVar1;
  undefined4 in_EAX;
  int compno;
  ulong uVar2;
  long lVar3;
  undefined4 uStack_38;
  opj_bool local_34;
  
  _uStack_38 = CONCAT44(dev_dump_flag,in_EAX);
  if (dev_dump_flag == 0) {
    fwrite("Image info {\n",0xd,1,(FILE *)out_stream);
    uStack_38 = (uint)(uint3)uStack_38;
    uVar1 = 9;
  }
  else {
    fwrite("[DEV] Dump an image_header struct {\n",0x24,1,_stdout);
    uVar1 = 0;
  }
  lVar3 = (long)&uStack_38 + 2;
  uStack_38._0_3_ = CONCAT12(uVar1,(undefined2)uStack_38);
  fprintf((FILE *)out_stream,"%s x0=%d, y0=%d\n",lVar3,(ulong)img_header->x0,(ulong)img_header->y0);
  fprintf((FILE *)out_stream,"%s x1=%d, y1=%d\n",lVar3,(ulong)img_header->x1,(ulong)img_header->y1);
  fprintf((FILE *)out_stream,"%s numcomps=%d\n",lVar3,(ulong)img_header->numcomps);
  if (img_header->comps != (opj_image_comp_t *)0x0) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < img_header->numcomps; uVar2 = uVar2 + 1) {
      fprintf((FILE *)out_stream,"%s\t component %d {\n",(long)&uStack_38 + 2,uVar2 & 0xffffffff);
      j2k_dump_image_comp_header
                ((opj_image_comp_t *)((long)&img_header->comps->dx + lVar3),local_34,out_stream);
      fprintf((FILE *)out_stream,"%s}\n",(long)&uStack_38 + 2);
      lVar3 = lVar3 + 0x38;
    }
  }
  fwrite("}\n",2,1,(FILE *)out_stream);
  return;
}

Assistant:

void j2k_dump_image_header(opj_image_t* img_header, opj_bool dev_dump_flag, FILE* out_stream)
{
	char tab[2];

	if (dev_dump_flag){
		fprintf(stdout, "[DEV] Dump an image_header struct {\n");
		tab[0] = '\0';
	}
	else {
		fprintf(out_stream, "Image info {\n");
		tab[0] = '\t';tab[1] = '\0';
	}

	fprintf(out_stream, "%s x0=%d, y0=%d\n", tab, img_header->x0, img_header->y0);
	fprintf(out_stream,	"%s x1=%d, y1=%d\n", tab, img_header->x1, img_header->y1);
	fprintf(out_stream, "%s numcomps=%d\n", tab, img_header->numcomps);

	if (img_header->comps){
		int compno;
		for (compno = 0; compno < img_header->numcomps; compno++) {
			fprintf(out_stream, "%s\t component %d {\n", tab, compno);
			j2k_dump_image_comp_header(&(img_header->comps[compno]), dev_dump_flag, out_stream);
			fprintf(out_stream,"%s}\n",tab);
		}
	}

	fprintf(out_stream, "}\n");
}